

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::Tables::AddCheckpoint(Tables *this)

{
  pointer *ppCVar1;
  iterator __position;
  CheckPoint local_24;
  
  CheckPoint::CheckPoint(&local_24,this);
  __position._M_current =
       (this->checkpoints_).
       super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
    ::_M_realloc_insert<google::protobuf::DescriptorPool::Tables::CheckPoint>
              (&this->checkpoints_,__position,&local_24);
  }
  else {
    (__position._M_current)->allocations_before_checkpoint = local_24.allocations_before_checkpoint;
    (__position._M_current)->pending_symbols_before_checkpoint =
         local_24.pending_symbols_before_checkpoint;
    (__position._M_current)->pending_files_before_checkpoint =
         local_24.pending_files_before_checkpoint;
    (__position._M_current)->pending_extensions_before_checkpoint =
         local_24.pending_extensions_before_checkpoint;
    (__position._M_current)->strings_before_checkpoint = local_24.strings_before_checkpoint;
    (__position._M_current)->messages_before_checkpoint = local_24.messages_before_checkpoint;
    (__position._M_current)->file_tables_before_checkpoint = local_24.file_tables_before_checkpoint;
    (__position._M_current)->allocations_before_checkpoint = local_24.allocations_before_checkpoint;
    ppCVar1 = &(this->checkpoints_).
               super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return;
}

Assistant:

void DescriptorPool::Tables::AddCheckpoint() {
  checkpoints_.push_back(CheckPoint(this));
}